

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

long __thiscall ExactFloat::ToInteger<long>(ExactFloat *this,RoundingMode mode)

{
  bool bVar1;
  int extraout_EAX;
  BIGNUM *bn;
  uint64 uVar2;
  longlong *plVar3;
  double __x;
  long local_60;
  int64 value;
  undefined4 local_44;
  undefined1 local_40 [8];
  ExactFloat r;
  int64 kMaxValue;
  int64 kMinValue;
  ExactFloat *pEStack_18;
  RoundingMode mode_local;
  ExactFloat *this_local;
  
  kMaxValue = -0x8000000000000000;
  r.bn_.bn_ = (BIGNUM *)0x7fffffffffffffff;
  kMinValue._4_4_ = mode;
  pEStack_18 = this;
  RoundToPowerOf2((ExactFloat *)local_40,(int)this,kRoundTiesToEven);
  bVar1 = is_nan((ExactFloat *)local_40);
  if (bVar1) {
    this_local = (ExactFloat *)0x7fffffffffffffff;
  }
  else {
    bVar1 = is_zero((ExactFloat *)local_40);
    if (bVar1) {
      this_local = (ExactFloat *)0x0;
    }
    else {
      bVar1 = is_inf((ExactFloat *)local_40);
      if ((bVar1) || (exp((ExactFloat *)local_40,__x), 0x3f < extraout_EAX)) {
        this_local = (ExactFloat *)0x7fffffffffffffff;
        if ((int)local_40._0_4_ < 0) {
          this_local = (ExactFloat *)0x8000000000000000;
        }
      }
      else {
        bn = BigNum::get((BigNum *)&r);
        uVar2 = BN_ext_get_uint64(bn);
        local_60 = uVar2 << (local_40[4] & 0x3f);
        if ((int)local_40._0_4_ < 0) {
          local_60 = -local_60;
        }
        plVar3 = std::min<long_long>((longlong *)&r.bn_,&local_60);
        plVar3 = std::max<long_long>(&kMaxValue,plVar3);
        this_local = (ExactFloat *)*plVar3;
      }
    }
  }
  local_44 = 1;
  ~ExactFloat((ExactFloat *)local_40);
  return (long)this_local;
}

Assistant:

T ExactFloat::ToInteger(RoundingMode mode) const {
  using std::numeric_limits;
  static_assert(sizeof(T) <= sizeof(uint64), "max 64 bits supported");
  static_assert(numeric_limits<T>::is_signed, "only signed types supported");
  const int64 kMinValue = numeric_limits<T>::min();
  const int64 kMaxValue = numeric_limits<T>::max();

  ExactFloat r = RoundToPowerOf2(0, mode);
  if (r.is_nan()) return kMaxValue;
  if (r.is_zero()) return 0;
  if (!r.is_inf()) {
    // If the unsigned value has more than 63 bits it is always clamped.
    if (r.exp() < 64) {
      int64 value = BN_ext_get_uint64(r.bn_.get()) << r.bn_exp_;
      if (r.sign_ < 0) value = -value;
      return max(kMinValue, min(kMaxValue, value));
    }
  }
  return (r.sign_ < 0) ? kMinValue : kMaxValue;
}